

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

int * Extra_DeriveRadixCode(int Number,int Radix,int nDigits)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (99 < nDigits) {
    __assert_fail("nDigits < 100",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                  ,0xa5,"int *Extra_DeriveRadixCode(int, int, int)");
  }
  uVar1 = (ulong)(uint)Number;
  uVar4 = 0;
  uVar3 = (ulong)(uint)nDigits;
  if (nDigits < 1) {
    uVar3 = uVar4;
  }
  for (; iVar2 = (int)uVar1, uVar3 * 4 != uVar4; uVar4 = uVar4 + 4) {
    uVar1 = (long)iVar2 / (long)Radix;
    *(int *)((long)Extra_DeriveRadixCode::Code + uVar4) = iVar2 % Radix;
  }
  if (iVar2 == 0) {
    return Extra_DeriveRadixCode::Code;
  }
  __assert_fail("Number == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                ,0xab,"int *Extra_DeriveRadixCode(int, int, int)");
}

Assistant:

int * Extra_DeriveRadixCode( int Number, int Radix, int nDigits )
{
    static int Code[100];
    int i;
    assert( nDigits < 100 );
    for ( i = 0; i < nDigits; i++ )
    {
        Code[i] = Number % Radix;
        Number  = Number / Radix;
    }
    assert( Number == 0 );
    return Code;
}